

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object.hpp
# Opt level: O2

void __thiscall chaiscript::dispatch::Dynamic_Object::~Dynamic_Object(Dynamic_Object *this)

{
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&(this->m_attrs)._M_t);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit Dynamic_Object(std::string t_type_name)
          : m_type_name(std::move(t_type_name))
          , m_option_explicit(false) {
      }